

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.h
# Opt level: O0

int sat_solver_add_const(sat_solver *pSat,int iVar,int fCompl)

{
  int iVar1;
  lit local_1c;
  int Cid;
  lit Lits [1];
  int fCompl_local;
  int iVar_local;
  sat_solver *pSat_local;
  
  Cid = fCompl;
  Lits[0] = iVar;
  if (iVar < 0) {
    __assert_fail("iVar >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                  ,0x134,"int sat_solver_add_const(sat_solver *, int, int)");
  }
  local_1c = toLitCond(iVar,fCompl);
  iVar1 = sat_solver_addclause(pSat,&local_1c,&Cid);
  if (iVar1 != 0) {
    return 1;
  }
  __assert_fail("Cid",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                ,0x138,"int sat_solver_add_const(sat_solver *, int, int)");
}

Assistant:

static inline int sat_solver_add_const( sat_solver * pSat, int iVar, int fCompl )
{
    lit Lits[1];
    int Cid;
    assert( iVar >= 0 );

    Lits[0] = toLitCond( iVar, fCompl );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 1 );
    assert( Cid );
    return 1;
}